

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2ShifterImmOperand(MCInst *Inst,uint32_t Val,uint64_t Address,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  DecodeStatus S;
  undefined4 local_24;
  
  local_24 = MCDisassembler_Success;
  if (in_ESI == 0x20) {
    local_24 = MCDisassembler_Fail;
  }
  MCOperand_CreateImm0(in_RDI,(ulong)in_ESI);
  return local_24;
}

Assistant:

static DecodeStatus DecodeT2ShifterImmOperand(MCInst *Inst, uint32_t Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	// Shift of "asr #32" is not allowed in Thumb2 mode.
	if (Val == 0x20)
		S = MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, Val);

	return S;
}